

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

lws_tls_extant lws_tls_generic_cert_checks(lws_vhost *vhost,char *cert,char *private_key)

{
  lws_tls_extant lVar1;
  lws_tls_extant lVar2;
  int m;
  int n;
  char *private_key_local;
  char *cert_local;
  lws_vhost *vhost_local;
  
  if ((cert == (char *)0x0) || (private_key == (char *)0x0)) {
    vhost_local._4_4_ = LWS_TLS_EXTANT_NO;
  }
  else {
    lVar1 = lws_tls_use_any_upgrade_check_extant(cert);
    if (lVar1 == LWS_TLS_EXTANT_ALTERNATIVE) {
      vhost_local._4_4_ = LWS_TLS_EXTANT_ALTERNATIVE;
    }
    else {
      lVar2 = lws_tls_use_any_upgrade_check_extant(private_key);
      if (lVar2 == LWS_TLS_EXTANT_ALTERNATIVE) {
        vhost_local._4_4_ = LWS_TLS_EXTANT_ALTERNATIVE;
      }
      else if (((lVar1 == LWS_TLS_EXTANT_NO) || (lVar2 == LWS_TLS_EXTANT_NO)) &&
              ((vhost->options & 0x4000000) != 0)) {
        _lws_log(4,"Ignoring missing %s or %s\n",cert,private_key);
        (vhost->tls).field_0x64 = (vhost->tls).field_0x64 & 0xfd | 2;
        vhost_local._4_4_ = LWS_TLS_EXTANT_NO;
      }
      else {
        vhost_local._4_4_ = LWS_TLS_EXTANT_YES;
      }
    }
  }
  return vhost_local._4_4_;
}

Assistant:

enum lws_tls_extant
lws_tls_generic_cert_checks(struct lws_vhost *vhost, const char *cert,
			    const char *private_key)
{
	int n, m;

	/*
	 * The user code can choose to either pass the cert and
	 * key filepaths using the info members like this, or it can
	 * leave them NULL; force the vhost SSL_CTX init using the info
	 * options flag LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX; and
	 * set up the cert himself using the user callback
	 * LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS, which
	 * happened just above and has the vhost SSL_CTX * in the user
	 * parameter.
	 */

	if (!cert || !private_key)
		return LWS_TLS_EXTANT_NO;

	n = lws_tls_use_any_upgrade_check_extant(cert);
	if (n == LWS_TLS_EXTANT_ALTERNATIVE)
		return LWS_TLS_EXTANT_ALTERNATIVE;
	m = lws_tls_use_any_upgrade_check_extant(private_key);
	if (m == LWS_TLS_EXTANT_ALTERNATIVE)
		return LWS_TLS_EXTANT_ALTERNATIVE;

	if ((n == LWS_TLS_EXTANT_NO || m == LWS_TLS_EXTANT_NO) &&
	    (vhost->options & LWS_SERVER_OPTION_IGNORE_MISSING_CERT)) {
		lwsl_notice("Ignoring missing %s or %s\n", cert, private_key);
		vhost->tls.skipped_certs = 1;

		return LWS_TLS_EXTANT_NO;
	}

	/*
	 * the cert + key exist
	 */

	return LWS_TLS_EXTANT_YES;
}